

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O0

int lj_cf_jit_util_tracemc(lua_State *L)

{
  TValue *pTVar1;
  GCtrace *pGVar2;
  GCstr *pGVar3;
  GCtrace *T;
  lua_State *L_local;
  
  pGVar2 = jit_checktrace(L);
  if ((pGVar2 == (GCtrace *)0x0) || (pGVar2->mcode == (MCode *)0x0)) {
    L_local._4_4_ = 0;
  }
  else {
    pTVar1 = L->top;
    pGVar3 = lj_str_new(L,(char *)pGVar2->mcode,(ulong)pGVar2->szmcode);
    pTVar1[-1].u64 = (ulong)pGVar3 | 0xfffd800000000000;
    pTVar1 = L->top;
    L->top = pTVar1 + 1;
    pTVar1->n = (double)(long)pGVar2->mcode;
    pTVar1 = L->top;
    L->top = pTVar1 + 1;
    pTVar1->n = (double)(int)pGVar2->mcloop;
    L_local._4_4_ = 3;
  }
  return L_local._4_4_;
}

Assistant:

LJLIB_CF(jit_util_tracemc)
{
  GCtrace *T = jit_checktrace(L);
  if (T && T->mcode != NULL) {
    setstrV(L, L->top-1, lj_str_new(L, (const char *)T->mcode, T->szmcode));
    setintptrV(L->top++, (intptr_t)(void *)T->mcode);
    setintV(L->top++, T->mcloop);
    return 3;
  }
  return 0;
}